

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowDemoWindow(bool *p_open)

{
  bool bVar1;
  ImGuiViewport *pIVar2;
  ImGuiIO *pIVar3;
  float fVar4;
  double dVar5;
  ImGuiBackendFlags backend_flags;
  ImGuiIO *io;
  bool *in_stack_00000030;
  ImGuiViewport *main_viewport;
  ImGuiWindowFlags window_flags;
  bool *in_stack_00000070;
  bool *in_stack_00000090;
  ImGuiStyle *in_stack_000000d0;
  bool *in_stack_000000e0;
  char *in_stack_000000e8;
  bool *in_stack_00000120;
  bool *in_stack_00000370;
  ImGuiWindowFlags in_stack_000003b4;
  bool *in_stack_000003b8;
  char *in_stack_000003c0;
  bool *in_stack_000004d0;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  bool *in_stack_ffffffffffffffc8;
  ImVec2 in_stack_ffffffffffffffd0;
  ImVec2 in_stack_ffffffffffffffd8;
  ImVec2 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (ShowDemoWindow::show_app_main_menu_bar) {
    ShowExampleAppMainMenuBar();
  }
  if ((ShowDemoWindow::show_app_documents & 1U) != 0) {
    ShowExampleAppDocuments(in_stack_00000030);
  }
  if ((ShowDemoWindow::show_app_console & 1U) != 0) {
    ShowExampleAppConsole((bool *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  if ((ShowDemoWindow::show_app_log & 1U) != 0) {
    ShowExampleAppLog((bool *)main_viewport);
  }
  if ((ShowDemoWindow::show_app_layout & 1U) != 0) {
    ShowExampleAppLayout(in_stack_00000070);
  }
  if ((ShowDemoWindow::show_app_property_editor & 1U) != 0) {
    ShowExampleAppPropertyEditor
              ((bool *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  if ((ShowDemoWindow::show_app_long_text & 1U) != 0) {
    ShowExampleAppLongText((bool *)main_viewport);
  }
  if ((ShowDemoWindow::show_app_auto_resize & 1U) != 0) {
    ShowExampleAppAutoResize((bool *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  if ((ShowDemoWindow::show_app_constrained_resize & 1U) != 0) {
    ShowExampleAppConstrainedResize(in_stack_00000090);
  }
  if ((ShowDemoWindow::show_app_simple_overlay & 1U) != 0) {
    ShowExampleAppSimpleOverlay
              ((bool *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  if ((ShowDemoWindow::show_app_fullscreen & 1U) != 0) {
    ShowExampleAppFullscreen((bool *)in_stack_ffffffffffffffe0);
  }
  if ((ShowDemoWindow::show_app_window_titles & 1U) != 0) {
    ShowExampleAppWindowTitles(in_stack_00000070);
  }
  if ((ShowDemoWindow::show_app_custom_rendering & 1U) != 0) {
    ShowExampleAppCustomRendering(in_stack_00000370);
  }
  if ((ShowDemoWindow::show_app_metrics & 1U) != 0) {
    ShowMetricsWindow(in_stack_000004d0);
  }
  if ((ShowDemoWindow::show_app_stack_tool & 1U) != 0) {
    ShowStackToolWindow(in_stack_00000120);
  }
  if ((ShowDemoWindow::show_app_about & 1U) != 0) {
    ShowAboutWindow((bool *)in_stack_ffffffffffffffe0);
  }
  if ((ShowDemoWindow::show_app_style_editor & 1U) != 0) {
    Begin(in_stack_000003c0,in_stack_000003b8,in_stack_000003b4);
    ShowStyleEditor(in_stack_000000d0);
    End();
  }
  pIVar2 = GetMainViewport();
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,(pIVar2->WorkPos).x + 650.0,
                 (pIVar2->WorkPos).y + 20.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
  SetNextWindowPos((ImVec2 *)&stack0xffffffffffffffe0,4,(ImVec2 *)&stack0xffffffffffffffd8);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,550.0,680.0);
  SetNextWindowSize((ImVec2 *)&stack0xffffffffffffffd0,4);
  bVar1 = Begin(in_stack_000003c0,in_stack_000003b8,in_stack_000003b4);
  if (bVar1) {
    GetFontSize();
    PushItemWidth(in_stack_ffffffffffffffc4);
    bVar1 = BeginMenuBar();
    if (bVar1) {
      bVar1 = BeginMenu((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0));
      if (bVar1) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x174,"Menu/File",GImGuiDemoMarkerCallbackUserData);
        }
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar1 = BeginMenu((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0));
      if (bVar1) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x17a,"Menu/Examples",GImGuiDemoMarkerCallbackUserData);
        }
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        EndMenu();
      }
      bVar1 = BeginMenu((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0));
      if (bVar1) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x18d,"Menu/Tools",GImGuiDemoMarkerCallbackUserData);
        }
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        MenuItem((char *)in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0));
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)","1.88 WIP");
    Spacing();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x19c,"Help",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = CollapsingHeader((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (ImGuiTreeNodeFlags)in_stack_ffffffffffffffb4);
    if (bVar1) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1b3,"Configuration",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = CollapsingHeader((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (ImGuiTreeNodeFlags)in_stack_ffffffffffffffb4);
    if (bVar1) {
      pIVar3 = GetIO();
      bVar1 = TreeNode((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (bVar1) {
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x1650e9);
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x16511b);
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x16514d);
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        if ((pIVar3->ConfigFlags & 0x10U) != 0) {
          dVar5 = GetTime();
          fVar4 = fmodf((float)dVar5,0.4);
          if (fVar4 < 0.2) {
            SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          bVar1 = IsKeyPressed((ImGuiKey)in_stack_ffffffffffffffc0,
                               SUB41((uint)in_stack_ffffffffffffffbc >> 0x18,0));
          if (bVar1) {
            pIVar3->ConfigFlags = pIVar3->ConfigFlags & 0xffffffef;
          }
        }
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x16520b);
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x16523c);
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x16526d);
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x16529e);
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x1652cf);
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        SameLine(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        HelpMarker((char *)0x165315);
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1de,"Configuration/Backend Flags",GImGuiDemoMarkerCallbackUserData);
      }
      bVar1 = TreeNode((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (bVar1) {
        HelpMarker((char *)0x16537c);
        in_stack_ffffffffffffffc4 = (float)pIVar3->BackendFlags;
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1f0,"Configuration/Style",GImGuiDemoMarkerCallbackUserData);
      }
      bVar1 = TreeNode((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (bVar1) {
        HelpMarker((char *)0x165439);
        ShowStyleEditor(in_stack_000000d0);
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1f9,"Configuration/Capture, Logging",GImGuiDemoMarkerCallbackUserData);
      }
      bVar1 = TreeNode((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (bVar1) {
        HelpMarker((char *)0x16549b);
        LogButtons();
        HelpMarker((char *)0x1654ac);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,0.0,0.0);
        bVar1 = Button((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (bVar1) {
          LogToClipboard((int)in_stack_ffffffffffffffb4);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x20d,"Window options",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = CollapsingHeader((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (ImGuiTreeNodeFlags)in_stack_ffffffffffffffb4);
    if (bVar1) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,0.0,0.0);
      bVar1 = BeginTable((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (int)in_stack_ffffffffffffffbc,(ImGuiTableFlags)in_stack_ffffffffffffffb8,
                         (ImVec2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
      if (bVar1) {
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        TableNextColumn();
        Checkbox(in_stack_000000e8,in_stack_000000e0);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();
    PopItemWidth();
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_documents = false;

    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_fullscreen = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_fullscreen)          ShowExampleAppFullscreen(&show_app_fullscreen);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_stack_tool = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_stack_tool)    { ImGui::ShowStackToolWindow(&show_app_stack_tool); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;
    static bool unsaved_document = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (unsaved_document)   window_flags |= ImGuiWindowFlags_UnsavedDocument;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(ImVec2(main_viewport->WorkPos.x + 650, main_viewport->WorkPos.y + 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            IMGUI_DEMO_MARKER("Menu/File");
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            IMGUI_DEMO_MARKER("Menu/Examples");
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Fullscreen window", NULL, &show_app_fullscreen);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        //if (ImGui::MenuItem("MenuItem")) {} // You can also use MenuItem() inside a menu bar!
        if (ImGui::BeginMenu("Tools"))
        {
            IMGUI_DEMO_MARKER("Menu/Tools");
#ifndef IMGUI_DISABLE_METRICS_WINDOW
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Stack Tool", NULL, &show_app_stack_tool);
#endif
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    IMGUI_DEMO_MARKER("Help");
    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    IMGUI_DEMO_MARKER("Configuration");
    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGuiKey_Space))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTrickleEventQueue", &io.ConfigInputTrickleEventQueue);
            ImGui::SameLine(); HelpMarker("Enable input queue trickling: some types of events submitted during the same frame (e.g. button down + up) will be spread over multiple frames, improving interactions with low framerates.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting).");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Backend Flags");
        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose them as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            // FIXME: We don't use BeginDisabled() to keep label bright, maybe we need a BeginReadonly() equivalent..
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",           &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",      &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",       &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Style");
        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Capture, Logging");
        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    IMGUI_DEMO_MARKER("Window options");
    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::TableNextColumn(); ImGui::Checkbox("Unsaved document", &unsaved_document);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}